

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void cloudCacheAllocate(CloudManager *dd,CloudOper oper)

{
  int iVar1;
  CloudCacheEntry2 *pCVar2;
  int nCacheEntries;
  CloudOper oper_local;
  CloudManager *dd_local;
  
  iVar1 = 1 << ((byte)dd->bitsCache[oper] & 0x1f);
  if (CacheSize[oper] == 1) {
    pCVar2 = (CloudCacheEntry2 *)calloc((long)iVar1,0x18);
    dd->tCaches[oper] = pCVar2;
    dd->nMemUsed = dd->nMemUsed + iVar1 * 0x18;
  }
  else if (CacheSize[oper] == 2) {
    pCVar2 = (CloudCacheEntry2 *)calloc((long)iVar1,0x20);
    dd->tCaches[oper] = pCVar2;
    dd->nMemUsed = dd->nMemUsed + iVar1 * 0x20;
  }
  else if (CacheSize[oper] == 3) {
    pCVar2 = (CloudCacheEntry2 *)calloc((long)iVar1,0x28);
    dd->tCaches[oper] = pCVar2;
    dd->nMemUsed = dd->nMemUsed + iVar1 * 0x28;
  }
  return;
}

Assistant:

void cloudCacheAllocate( CloudManager * dd, CloudOper oper )
{
    int nCacheEntries = (1 << dd->bitsCache[oper]);

    if ( CacheSize[oper] == 1 )
    {
        dd->tCaches[oper] = (CloudCacheEntry2 *)ABC_CALLOC( CloudCacheEntry1, nCacheEntries );
        dd->nMemUsed     += sizeof(CloudCacheEntry1) * nCacheEntries;
    }
    else if ( CacheSize[oper] == 2 )
    {
        dd->tCaches[oper] = (CloudCacheEntry2 *)ABC_CALLOC( CloudCacheEntry2, nCacheEntries );
        dd->nMemUsed     += sizeof(CloudCacheEntry2) * nCacheEntries;
    }
    else if ( CacheSize[oper] == 3 )
    {
        dd->tCaches[oper] = (CloudCacheEntry2 *)ABC_CALLOC( CloudCacheEntry3, nCacheEntries );
        dd->nMemUsed     += sizeof(CloudCacheEntry3) * nCacheEntries;
    }
}